

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BCPos bcemit_branch(FuncState *fs,ExpDesc *e,int cond)

{
  uint uVar1;
  uint uVar2;
  BCPos BVar3;
  
  if (e->k == VRELOCABLE) {
    uVar1 = (e->u).s.info;
    uVar2 = fs->bcbase[uVar1].ins;
    if ((uVar2 & 0xff) == 0x13) {
      fs->bcbase[uVar1].ins = uVar2 & 0xffff0000 | 0xf - (cond == 0);
      BVar3 = bcemit_jmp(fs);
      return BVar3;
    }
  }
  if (e->k != VNONRELOC) {
    bcreg_reserve(fs,1);
    expr_toreg_nobranch(fs,e,fs->freereg - 1);
  }
  bcemit_INS(fs,(uint)(cond == 0) + (e->u).s.info * 0x10000 + 0xff0c);
  BVar3 = bcemit_jmp(fs);
  if ((e->k == VNONRELOC) && (fs->nactvar <= (e->u).s.info)) {
    fs->freereg = fs->freereg - 1;
  }
  return BVar3;
}

Assistant:

static BCPos bcemit_branch(FuncState *fs, ExpDesc *e, int cond)
{
  BCPos pc;
  if (e->k == VRELOCABLE) {
    BCIns *ip = bcptr(fs, e);
    if (bc_op(*ip) == BC_NOT) {
      *ip = BCINS_AD(cond ? BC_ISF : BC_IST, 0, bc_d(*ip));
      return bcemit_jmp(fs);
    }
  }
  if (e->k != VNONRELOC) {
    bcreg_reserve(fs, 1);
    expr_toreg_nobranch(fs, e, fs->freereg-1);
  }
  bcemit_AD(fs, cond ? BC_ISTC : BC_ISFC, NO_REG, e->u.s.info);
  pc = bcemit_jmp(fs);
  expr_free(fs, e);
  return pc;
}